

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsDomain.cpp
# Opt level: O0

double __thiscall HighsDomain::doChangeBound(HighsDomain *this,HighsDomainChange *boundchg)

{
  double dVar1;
  reference pvVar2;
  reference pvVar3;
  double *in_RSI;
  vector<int,_std::allocator<int>_> *in_RDI;
  double oldbound;
  double in_stack_000002e8;
  double in_stack_000002f0;
  HighsInt in_stack_000002fc;
  HighsDomain *in_stack_00000300;
  value_type_conflict2 *in_stack_ffffffffffffffd8;
  value_type_conflict2 *__x;
  double local_18;
  
  if (*(int *)((long)in_RSI + 0xc) == 0) {
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)
                        &in_RDI[0x20].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish,(long)*(int *)(in_RSI + 1));
    local_18 = *pvVar2;
    __x = (value_type_conflict2 *)*in_RSI;
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)
                        &in_RDI[0x20].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish,(long)*(int *)(in_RSI + 1));
    *pvVar2 = (value_type)__x;
    if ((local_18 != *in_RSI) || (NAN(local_18) || NAN(*in_RSI))) {
      if (((ulong)in_RDI[0x1a].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage & 1) == 0) {
        updateActivityLbChange
                  (in_stack_00000300,in_stack_000002fc,in_stack_000002f0,in_stack_000002e8);
      }
      pvVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_RDI,
                          (long)*(int *)(in_RSI + 1));
      if (*pvVar3 == '\0') {
        pvVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                           ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_RDI,
                            (long)*(int *)(in_RSI + 1));
        *pvVar3 = '\x01';
        std::vector<int,_std::allocator<int>_>::push_back(in_RDI,__x);
      }
    }
  }
  else {
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)
                        &in_RDI[0x21].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish,(long)*(int *)(in_RSI + 1));
    local_18 = *pvVar2;
    dVar1 = *in_RSI;
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)
                        &in_RDI[0x21].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish,(long)*(int *)(in_RSI + 1));
    *pvVar2 = dVar1;
    if ((local_18 != *in_RSI) || (NAN(local_18) || NAN(*in_RSI))) {
      if (((ulong)in_RDI[0x1a].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage & 1) == 0) {
        updateActivityUbChange
                  (in_stack_00000300,in_stack_000002fc,in_stack_000002f0,in_stack_000002e8);
      }
      pvVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_RDI,
                          (long)*(int *)(in_RSI + 1));
      if (*pvVar3 == '\0') {
        pvVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                           ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_RDI,
                            (long)*(int *)(in_RSI + 1));
        *pvVar3 = '\x01';
        std::vector<int,_std::allocator<int>_>::push_back(in_RDI,in_stack_ffffffffffffffd8);
      }
    }
  }
  return local_18;
}

Assistant:

double HighsDomain::doChangeBound(const HighsDomainChange& boundchg) {
  double oldbound;

  if (boundchg.boundtype == HighsBoundType::kLower) {
    oldbound = col_lower_[boundchg.column];
    col_lower_[boundchg.column] = boundchg.boundval;
    if (oldbound != boundchg.boundval) {
      if (!infeasible_)
        updateActivityLbChange(boundchg.column, oldbound, boundchg.boundval);

      if (!changedcolsflags_[boundchg.column]) {
        changedcolsflags_[boundchg.column] = 1;
        changedcols_.push_back(boundchg.column);
      }
    }
  } else {
    oldbound = col_upper_[boundchg.column];
    col_upper_[boundchg.column] = boundchg.boundval;
    if (oldbound != boundchg.boundval) {
      if (!infeasible_)
        updateActivityUbChange(boundchg.column, oldbound, boundchg.boundval);

      if (!changedcolsflags_[boundchg.column]) {
        changedcolsflags_[boundchg.column] = 1;
        changedcols_.push_back(boundchg.column);
      }
    }
  }

  return oldbound;
}